

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O0

void __thiscall
wasm::PrintExpressionContents::visitArrayInitData(PrintExpressionContents *this,ArrayInitData *curr)

{
  ostream *o;
  HeapType type;
  string_view local_28;
  ArrayInitData *local_18;
  ArrayInitData *curr_local;
  PrintExpressionContents *this_local;
  
  o = this->o;
  local_18 = curr;
  curr_local = (ArrayInitData *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_28,"array.init_data ");
  printMedium(o,local_28);
  type = wasm::Type::getHeapType(&local_18->ref->type);
  printHeapTypeName(this,type);
  std::operator<<(this->o,' ');
  wasm::Name::print(&local_18->segment,this->o);
  return;
}

Assistant:

void visitArrayInitData(ArrayInitData* curr) {
    printMedium(o, "array.init_data ");
    printHeapTypeName(curr->ref->type.getHeapType());
    o << ' ';
    curr->segment.print(o);
  }